

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void PathBezierToCasteljau
               (ImVector<ImVec2> *path,float x1,float y1,float x2,float y2,float x3,float y3,
               float x4,float y4,float tess_tol,int level)

{
  ImVec2 *__dest;
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float y2_00;
  float fVar9;
  float y4_00;
  
  iVar3 = 10;
  if (10 < level) {
    iVar3 = level;
  }
  iVar2 = level + 1;
  while( true ) {
    fVar8 = x4 - x1;
    fVar9 = y4 - y1;
    fVar6 = fVar9 * (x2 - x4) - fVar8 * (y2 - y4);
    fVar7 = fVar9 * (x3 - x4) - fVar8 * (y3 - y4);
    uVar4 = -(uint)(-fVar6 <= fVar6);
    uVar5 = -(uint)(-fVar7 <= fVar7);
    fVar6 = (float)(~uVar5 & (uint)-fVar7 | (uint)fVar7 & uVar5) +
            (float)(~uVar4 & (uint)-fVar6 | (uint)fVar6 & uVar4);
    if (fVar6 * fVar6 < (fVar8 * fVar8 + fVar9 * fVar9) * tess_tol) {
      iVar3 = path->Size;
      if (iVar3 == path->Capacity) {
        if (iVar3 == 0) {
          iVar2 = 8;
        }
        else {
          iVar2 = iVar3 / 2 + iVar3;
        }
        iVar1 = iVar3 + 1;
        if (iVar3 + 1 < iVar2) {
          iVar1 = iVar2;
        }
        __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar1 << 3);
        if (path->Data != (ImVec2 *)0x0) {
          memcpy(__dest,path->Data,(long)path->Size << 3);
          ImGui::MemFree(path->Data);
        }
        path->Data = __dest;
        path->Capacity = iVar1;
        iVar3 = path->Size;
      }
      else {
        __dest = path->Data;
      }
      __dest[iVar3].x = x4;
      __dest[iVar3].y = y4;
      path->Size = path->Size + 1;
      return;
    }
    if (iVar2 - iVar3 == 1) break;
    fVar6 = (x3 + x2) * 0.5;
    fVar8 = (y3 + y2) * 0.5;
    fVar9 = (x2 + x1) * 0.5;
    x3 = (x4 + x3) * 0.5;
    fVar7 = (fVar6 + fVar9) * 0.5;
    x2 = (fVar6 + x3) * 0.5;
    y2_00 = (y2 + y1) * 0.5;
    y3 = (y4 + y3) * 0.5;
    fVar6 = (fVar8 + y2_00) * 0.5;
    y2 = (fVar8 + y3) * 0.5;
    fVar8 = (x2 + fVar7) * 0.5;
    y4_00 = (y2 + fVar6) * 0.5;
    PathBezierToCasteljau(path,x1,y1,fVar9,y2_00,fVar7,fVar6,fVar8,y4_00,tess_tol,iVar2);
    iVar2 = iVar2 + 1;
    x1 = fVar8;
    y1 = y4_00;
  }
  return;
}

Assistant:

static void PathBezierToCasteljau(ImVector<ImVec2>* path, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        path->push_back(ImVec2(x4, y4));
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2)*0.5f,       y12 = (y1 + y2)*0.5f;
        float x23 = (x2 + x3)*0.5f,       y23 = (y2 + y3)*0.5f;
        float x34 = (x3 + x4)*0.5f,       y34 = (y3 + y4)*0.5f;
        float x123 = (x12 + x23)*0.5f,    y123 = (y12 + y23)*0.5f;
        float x234 = (x23 + x34)*0.5f,    y234 = (y23 + y34)*0.5f;
        float x1234 = (x123 + x234)*0.5f, y1234 = (y123 + y234)*0.5f;
        PathBezierToCasteljau(path, x1, y1,        x12, y12,    x123, y123,  x1234, y1234, tess_tol, level + 1);
        PathBezierToCasteljau(path, x1234, y1234,  x234, y234,  x34, y34,    x4, y4,       tess_tol, level + 1);
    }
}